

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int uv__async_fork(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  int iVar3;
  uv__queue queue;
  uv__queue local_20;
  
  if ((loop->async_io_watcher).fd != -1) {
    puVar1 = &loop->async_handles;
    local_20.next = (loop->async_handles).next;
    if (local_20.next == puVar1) {
      local_20.next = &local_20;
    }
    else {
      local_20.prev = (loop->async_handles).prev;
      (local_20.prev)->next = &local_20;
      puVar2 = (local_20.next)->prev;
      (loop->async_handles).prev = puVar2;
      puVar2->next = puVar1;
    }
    (local_20.next)->prev = &local_20;
    while (local_20.next != &local_20) {
      (local_20.next)->prev->next = (local_20.next)->next;
      (local_20.next)->next->prev = (local_20.next)->prev;
      (local_20.next)->next = puVar1;
      puVar2 = (loop->async_handles).prev;
      (local_20.next)->prev = puVar2;
      puVar2->next = local_20.next;
      (loop->async_handles).prev = local_20.next;
      *(undefined4 *)&local_20.next[1].next = 0;
      *(undefined4 *)&local_20.next[-4].prev = 0;
    }
    iVar3 = loop->async_wfd;
    if (iVar3 != -1) {
      if (iVar3 != (loop->async_io_watcher).fd) {
        uv__close(iVar3);
      }
      loop->async_wfd = -1;
    }
    uv__io_stop(loop,&loop->async_io_watcher,1);
    uv__close((loop->async_io_watcher).fd);
    (loop->async_io_watcher).fd = -1;
    iVar3 = uv__async_start(loop);
    return iVar3;
  }
  return 0;
}

Assistant:

int uv__async_fork(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1) /* never started */
    return 0;

  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    /* The state of any thread that set pending is now likely corrupt in this
     * child because the user called fork, so just clear these flags and move
     * on. Calling most libc functions after `fork` is declared to be undefined
     * behavior anyways, unless async-signal-safe, for multithreaded programs
     * like libuv, and nothing interesting in pthreads is async-signal-safe.
     */
    h->pending = 0;
    /* This is the busy flag, and we just abruptly lost all other threads. */
    h->u.fd = 0;
  }

  /* Recreate these, since they still exist, but belong to the wrong pid now. */
  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;

  return uv__async_start(loop);
}